

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.cpp
# Opt level: O1

void __thiscall Js::StreamWriter::WriteHostObject(StreamWriter *this,void *data)

{
  bool bVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  void *__frameAddr;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
  LeaveScriptObject<true,_true,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_58,scriptContext,&stack0xfffffffffffffff8
            );
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  (*this->m_stream->_vptr_HostStream[1])(this->m_stream,data);
  ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
  pTVar2->reentrancySafeOrHandled = bVar1;
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_58);
  return;
}

Assistant:

void StreamWriter::WriteHostObject(void* data)
    {
        ScriptContext* scriptContext = GetScriptContext();
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            m_stream->WriteHostObject(data);
        }
        END_LEAVE_SCRIPT(scriptContext);
    }